

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestCase *
vkt::createFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,
          Function_conflict1 initPrograms,Function_conflict1 testFunction,CaseDef_conflict1 *arg0)

{
  Function_conflict1 func_;
  Function_conflict1 desc_00;
  string *name_00;
  TestNodeType type_00;
  TestContext *testCtx_00;
  InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
  *this;
  CaseDef_conflict1 local_a4;
  Args_conflict1 local_80;
  FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_conflict1 local_40;
  Function_conflict1 local_38;
  Function_conflict1 testFunction_local;
  Function_conflict1 initPrograms_local;
  string *desc_local;
  string *name_local;
  TestContext *pTStack_10;
  TestNodeType type_local;
  TestContext *testCtx_local;
  
  local_38 = testFunction;
  testFunction_local = (Function_conflict1)initPrograms;
  initPrograms_local = (Function_conflict1)desc;
  desc_local = name;
  name_local._4_4_ = type;
  pTStack_10 = testCtx;
  this = (InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
          *)operator_new(0xa8);
  testCtx_00 = pTStack_10;
  type_00 = name_local._4_4_;
  name_00 = desc_local;
  desc_00 = initPrograms_local;
  FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>::FunctionPrograms1
            ((FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef> *)&local_40,
             (Function_conflict1)testFunction_local);
  func_ = local_38;
  pipeline::anon_unknown_0::CaseDef::CaseDef((CaseDef *)&local_a4,arg0);
  FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args::Args
            ((Args *)&local_80,func_,&local_a4);
  InstanceFactory1<vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::pipeline::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::pipeline::(anonymous_namespace)::CaseDef>_>
  ::InstanceFactory1(this,testCtx_00,type_00,name_00,(string *)desc_00,&local_40,&local_80);
  return &this->super_TestCase;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}